

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXWebSocketHandshake.cpp
# Opt level: O0

string * __thiscall
ix::WebSocketHandshake::genRandomString_abi_cxx11_
          (string *__return_storage_ptr__,WebSocketHandshake *this,int len)

{
  undefined1 uVar1;
  result_type rVar2;
  int iVar3;
  undefined1 *puVar4;
  int local_13f8;
  int x;
  int i;
  uniform_int_distribution<int> dist;
  default_random_engine e1;
  random_device r;
  allocator local_41;
  string local_40 [8];
  string alphanum;
  int len_local;
  WebSocketHandshake *this_local;
  string *s;
  
  alphanum.field_2._12_4_ = len;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"0123456789ABCDEFGHabcdefgh",&local_41);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  ::std::random_device::random_device((random_device *)&e1);
  rVar2 = ::std::random_device::operator()((random_device *)&e1);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&dist,
             (ulong)rVar2);
  iVar3 = ::std::__cxx11::string::size();
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)&i,0,iVar3 + -1);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  for (local_13f8 = 0; local_13f8 < (int)alphanum.field_2._12_4_; local_13f8 = local_13f8 + 1) {
    ::std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&i,
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&dist);
    puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_40);
    uVar1 = *puVar4;
    puVar4 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar4 = uVar1;
  }
  ::std::random_device::~random_device((random_device *)&e1);
  ::std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string WebSocketHandshake::genRandomString(const int len)
    {
        std::string alphanum =
            "0123456789"
            "ABCDEFGH"
            "abcdefgh";

        std::random_device r;
        std::default_random_engine e1(r());
        std::uniform_int_distribution<int> dist(0, (int) alphanum.size() - 1);

        std::string s;
        s.resize(len);

        for (int i = 0; i < len; ++i)
        {
            int x = dist(e1);
            s[i] = alphanum[x];
        }

        return s;
    }